

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi.cpp
# Opt level: O0

int32_t __thiscall
icu_63::RuleBasedBreakIterator::following(RuleBasedBreakIterator *this,int32_t startPos)

{
  int64_t iVar1;
  int local_2c;
  UErrorCode local_20;
  int32_t local_1c;
  UErrorCode status;
  int32_t startPos_local;
  RuleBasedBreakIterator *this_local;
  
  local_1c = startPos;
  _status = this;
  if (startPos < 0) {
    this_local._4_4_ = (*(this->super_BreakIterator).super_UObject._vptr_UObject[10])();
  }
  else {
    utext_setNativeIndex_63(&this->fText,(long)startPos);
    iVar1 = utext_getNativeIndex_63(&this->fText);
    local_1c = (int32_t)iVar1;
    local_20 = U_ZERO_ERROR;
    BreakCache::following(this->fBreakCache,local_1c,&local_20);
    if (this->fDone == '\0') {
      local_2c = this->fPosition;
    }
    else {
      local_2c = -1;
    }
    this_local._4_4_ = local_2c;
  }
  return this_local._4_4_;
}

Assistant:

int32_t RuleBasedBreakIterator::following(int32_t startPos) {
    // if the supplied position is before the beginning, return the
    // text's starting offset
    if (startPos < 0) {
        return first();
    }

    // Move requested offset to a code point start. It might be on a trail surrogate,
    // or on a trail byte if the input is UTF-8. Or it may be beyond the end of the text.
    utext_setNativeIndex(&fText, startPos);
    startPos = (int32_t)utext_getNativeIndex(&fText);

    UErrorCode status = U_ZERO_ERROR;
    fBreakCache->following(startPos, status);
    return fDone ? UBRK_DONE : fPosition;
}